

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O0

void __thiscall
ASDCP::MXF::OPAtomIndexFooter::SetIndexParamsCBR
          (OPAtomIndexFooter *this,IPrimerLookup *lookup,ui32_t size,Rational *Rate)

{
  IndexTableSegment *this_00;
  IndexTableSegment *Index;
  Rational *Rate_local;
  ui32_t size_local;
  IPrimerLookup *lookup_local;
  OPAtomIndexFooter *this_local;
  
  if (lookup != (IPrimerLookup *)0x0) {
    this->m_Lookup = lookup;
    this->m_BytesPerEditUnit = size;
    Rational::operator=(&this->m_EditRate,Rate);
    this_00 = (IndexTableSegment *)operator_new(0x120);
    IndexTableSegment::IndexTableSegment(this_00,(this->super_Partition).m_Dict);
    (*(this->super_Partition).super_KLVFilePacket.super_KLVPacket._vptr_KLVPacket[0xd])
              (this,this_00);
    this_00->EditUnitByteCount = this->m_BytesPerEditUnit;
    Rational::operator=(&this_00->IndexEditRate,Rate);
    return;
  }
  __assert_fail("lookup",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/MXF.cpp",
                0x551,
                "virtual void ASDCP::MXF::OPAtomIndexFooter::SetIndexParamsCBR(IPrimerLookup *, ui32_t, const Rational &)"
               );
}

Assistant:

void
ASDCP::MXF::OPAtomIndexFooter::SetIndexParamsCBR(IPrimerLookup* lookup, ui32_t size, const Rational& Rate)
{
  assert(lookup);
  m_Lookup = lookup;
  m_BytesPerEditUnit = size;
  m_EditRate = Rate;

  IndexTableSegment* Index = new IndexTableSegment(m_Dict);
  AddChildObject(Index);
  Index->EditUnitByteCount = m_BytesPerEditUnit;
  Index->IndexEditRate = Rate;
}